

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall
wabt::TypeChecker::PopAndCheck2Types(TypeChecker *this,Type expected1,Type expected2,char *desc)

{
  Result RVar1;
  char *desc_local;
  TypeChecker *this_local;
  Type expected2_local;
  Type expected1_local;
  Result result;
  
  Result::Result((Result *)&expected1_local,Ok);
  RVar1 = PeekAndCheckType(this,0,expected2);
  Result::operator|=((Result *)&expected1_local,RVar1);
  RVar1 = PeekAndCheckType(this,1,expected1);
  Result::operator|=((Result *)&expected1_local,RVar1);
  PrintStackIfFailed<wabt::Type,wabt::Type>
            (this,(Result)expected1_local.enum_,desc,expected1,expected2);
  RVar1 = DropTypes(this,2);
  Result::operator|=((Result *)&expected1_local,RVar1);
  return (Result)expected1_local.enum_;
}

Assistant:

Result TypeChecker::PopAndCheck2Types(Type expected1,
                                      Type expected2,
                                      const char* desc) {
  Result result = Result::Ok;
  result |= PeekAndCheckType(0, expected2);
  result |= PeekAndCheckType(1, expected1);
  PrintStackIfFailed(result, desc, expected1, expected2);
  result |= DropTypes(2);
  return result;
}